

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O2

LayoutElement * __thiscall
Diligent::DynamicLinearAllocator::ConstructArray<Diligent::LayoutElement>
          (DynamicLinearAllocator *this,size_t count)

{
  LayoutElement *pLVar1;
  LayoutElement *this_00;
  bool bVar2;
  
  pLVar1 = Allocate<Diligent::LayoutElement>(this,count);
  this_00 = pLVar1;
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    LayoutElement::LayoutElement(this_00);
    this_00 = this_00 + 1;
  }
  return pLVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }